

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O0

Fraig_NodeVec_t * Fraig_FeedBackCoveringStart(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  Fraig_NodeVec_t *p_00;
  Fraig_Node_t *pFVar5;
  int local_60;
  int local_5c;
  int w;
  int m;
  int k;
  int i;
  uint *pUnsigned2;
  uint *pUnsigned1;
  uint *pSims;
  Fraig_Node_t *pEntD;
  Fraig_Node_t *pEntF;
  Fraig_HashTable_t *pT;
  Fraig_NodeVec_t *vColumns;
  Fraig_Man_t *p_local;
  
  pFVar1 = p->pTableF;
  p_00 = Fraig_NodeVecAlloc(100);
  for (m = 0; m < pFVar1->nBins; m = m + 1) {
    for (pEntD = pFVar1->pBins[m]; pEntD != (Fraig_Node_t *)0x0; pEntD = pEntD->pNextF) {
      p->vCones->nSize = 0;
      for (pSims = (uint *)pEntD; pSims != (uint *)0x0; pSims = *(uint **)(pSims + 0x12)) {
        Fraig_NodeVecPush(p->vCones,(Fraig_Node_t *)pSims);
      }
      if ((p->vCones->nSize != 1) && (p->vCones->nSize < 0x15)) {
        for (w = 0; local_5c = w, w < p->vCones->nSize; w = w + 1) {
          while (local_5c = local_5c + 1, local_5c < p->vCones->nSize) {
            iVar4 = Fraig_CompareSimInfoUnderMask
                              (p->vCones->pArray[w],p->vCones->pArray[local_5c],p->iWordStart,0,
                               p->pSimsReal);
            if (iVar4 != 0) {
              pFVar5 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
              puVar2 = p->vCones->pArray[w]->puSimD;
              puVar3 = p->vCones->pArray[local_5c]->puSimD;
              for (local_60 = 0; local_60 < p->iWordStart; local_60 = local_60 + 1) {
                (&pFVar5->Num)[local_60] =
                     (puVar2[local_60] ^ puVar3[local_60]) & (p->pSimsReal[local_60] ^ 0xffffffff);
              }
              Fraig_NodeVecPush(p_00,pFVar5);
            }
          }
        }
      }
    }
  }
  if (p->fDoSparse != 0) {
    pFVar1 = p->pTableF0;
    for (m = 0; m < pFVar1->nBins; m = m + 1) {
      for (pEntD = pFVar1->pBins[m]; pEntD != (Fraig_Node_t *)0x0; pEntD = pEntD->pNextF) {
        pEntD->uHashD = 0;
        for (local_60 = 0; local_60 < p->iWordStart; local_60 = local_60 + 1) {
          pEntD->uHashD =
               (pEntD->puSimD[local_60] & p->pSimsReal[local_60]) * s_FraigPrimes[local_60] ^
               pEntD->uHashD;
        }
      }
    }
    Fraig_TableRehashF0(p,1);
    for (m = 0; m < pFVar1->nBins; m = m + 1) {
      for (pEntD = pFVar1->pBins[m]; pEntD != (Fraig_Node_t *)0x0; pEntD = pEntD->pNextF) {
        p->vCones->nSize = 0;
        for (pSims = (uint *)pEntD; pSims != (uint *)0x0; pSims = *(uint **)(pSims + 0x12)) {
          Fraig_NodeVecPush(p->vCones,(Fraig_Node_t *)pSims);
        }
        if (p->vCones->nSize != 1) {
          for (w = 0; local_5c = w, w < p->vCones->nSize; w = w + 1) {
            while (local_5c = local_5c + 1, local_5c < p->vCones->nSize) {
              pFVar5 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
              puVar2 = p->vCones->pArray[w]->puSimD;
              puVar3 = p->vCones->pArray[local_5c]->puSimD;
              for (local_60 = 0; local_60 < p->iWordStart; local_60 = local_60 + 1) {
                (&pFVar5->Num)[local_60] =
                     (puVar2[local_60] ^ puVar3[local_60]) & (p->pSimsReal[local_60] ^ 0xffffffff);
              }
              Fraig_NodeVecPush(p_00,pFVar5);
            }
          }
        }
      }
    }
  }
  return p_00;
}

Assistant:

Fraig_NodeVec_t * Fraig_FeedBackCoveringStart( Fraig_Man_t * p )
{
    Fraig_NodeVec_t * vColumns;
    Fraig_HashTable_t * pT = p->pTableF;
    Fraig_Node_t * pEntF, * pEntD;
    unsigned * pSims;
    unsigned * pUnsigned1, * pUnsigned2;
    int i, k, m, w;//, nOnes;

    // start the set of columns
    vColumns = Fraig_NodeVecAlloc( 100 );

    // go through the pairs of nodes to be distinguished
    for ( i = 0; i < pT->nBins; i++ )
    Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryD( pEntF, pEntD )
            Fraig_NodeVecPush( p->vCones, pEntD );
        if ( p->vCones->nSize == 1 )
            continue;
        //////////////////////////////// bug fix by alanmi, September 14, 2006
        if ( p->vCones->nSize > 20 ) 
            continue;
        ////////////////////////////////

        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                if ( !Fraig_CompareSimInfoUnderMask( p->vCones->pArray[k], p->vCones->pArray[m], p->iWordStart, 0, p->pSimsReal ) )
                    continue;

                // primary simulation patterns (counter-examples) cannot distinguish this pair
                // get memory to store the feasible simulation patterns
                pSims = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
                // find the pattern that distinguish this column, exept the primary ones
                pUnsigned1 = p->vCones->pArray[k]->puSimD;
                pUnsigned2 = p->vCones->pArray[m]->puSimD;
                for ( w = 0; w < p->iWordStart; w++ )
                    pSims[w] = (pUnsigned1[w] ^ pUnsigned2[w]) & ~p->pSimsReal[w];
                // store the pattern
                Fraig_NodeVecPush( vColumns, (Fraig_Node_t *)pSims );
//                nOnes = Fraig_BitStringCountOnes(pSims, p->iWordStart);
//                assert( nOnes > 0 );
            }      
    }

    // if the flag is not set, do not consider sparse nodes in p->pTableF0
    if ( !p->fDoSparse )
        return vColumns;

    // recalculate their hash values based on p->pSimsReal
    pT = p->pTableF0;
    for ( i = 0; i < pT->nBins; i++ )
    Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
    {
        pSims = pEntF->puSimD;
        pEntF->uHashD = 0;
        for ( w = 0; w < p->iWordStart; w++ )
            pEntF->uHashD ^= (pSims[w] & p->pSimsReal[w]) * s_FraigPrimes[w];
    }

    // rehash the table using these values
    Fraig_TableRehashF0( p, 1 );

    // collect the classes of equivalent node pairs
    for ( i = 0; i < pT->nBins; i++ )
    Fraig_TableBinForEachEntryF( pT->pBins[i], pEntF )
    {
        p->vCones->nSize = 0;
        Fraig_TableBinForEachEntryD( pEntF, pEntD )
            Fraig_NodeVecPush( p->vCones, pEntD );
        if ( p->vCones->nSize == 1 )
            continue;

        // primary simulation patterns (counter-examples) cannot distinguish all these pairs
        for ( k = 0; k < p->vCones->nSize; k++ )
            for ( m = k+1; m < p->vCones->nSize; m++ )
            {
                // get memory to store the feasible simulation patterns
                pSims = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
                // find the patterns that are not distinquished
                pUnsigned1 = p->vCones->pArray[k]->puSimD;
                pUnsigned2 = p->vCones->pArray[m]->puSimD;
                for ( w = 0; w < p->iWordStart; w++ )
                    pSims[w] = (pUnsigned1[w] ^ pUnsigned2[w]) & ~p->pSimsReal[w];
                // store the pattern
                Fraig_NodeVecPush( vColumns, (Fraig_Node_t *)pSims );
//                nOnes = Fraig_BitStringCountOnes(pSims, p->iWordStart);
//                assert( nOnes > 0 );
            }      
    }
    return vColumns;
}